

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_deltaeta_chdep
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta13,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta13_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta13,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta13_err)

{
  reference pvVar1;
  reference pvVar2;
  long in_RDI;
  double dVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000010;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000018;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000020;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000028;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000030;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000038;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000040;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000048;
  double temp_os_13;
  double temp_os_12;
  double temp_ss_13;
  double temp_ss_12;
  int j;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_err;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_1;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffba0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  size_type in_stack_fffffffffffffba8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbb0;
  value_type vVar4;
  int local_284;
  int local_280;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffdd8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffde0;
  pointer in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffdf8;
  singleParticleSpectra *in_stack_fffffffffffffe00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe28;
  pointer in_stack_fffffffffffffe30;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_198;
  undefined8 local_178;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_158;
  undefined8 local_138;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_118;
  undefined8 local_f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  undefined8 local_b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98 [2];
  undefined8 local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48 [3];
  
  local_68 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16f92e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f96a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16f99e);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16f9b8);
  local_b8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16f9ff);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fa3b);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fa6f);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16fa89);
  local_f8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16fad0);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fb0c);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fb40);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16fb5a);
  local_138 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16fba1);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fbdd);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fc11);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16fc2b);
  local_178 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16fc72);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fcae);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fce2);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16fcfc);
  std::allocator<double>::allocator((allocator<double> *)0x16fd43);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fd7f);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fdb3);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16fdcd);
  std::allocator<double>::allocator((allocator<double> *)0x16fe14);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fe50);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fe84);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16fe9e);
  std::allocator<double>::allocator((allocator<double> *)0x16fee5);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16ff21);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16ff55);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x16ff6f);
  std::allocator<double>::allocator((allocator<double> *)0x16ffb6);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (value_type *)in_stack_fffffffffffffba0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x16fff2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x170026);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffba0);
  std::allocator<double>::~allocator((allocator<double> *)0x170040);
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  this_00 = &local_118;
  calculate_three_particle_correlation_deltaeta
            (in_stack_fffffffffffffe00,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe28,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe30);
  for (local_280 = 0; local_280 < *(int *)(in_RDI + 0x538); local_280 = local_280 + 1) {
    for (local_284 = 0; local_284 < *(int *)(in_RDI + 0x254); local_284 = local_284 + 1) {
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_48,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      vVar4 = *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_98,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      dVar3 = vVar4 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000010,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000018,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 * dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_d8,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      dVar3 = *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_118,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      dVar3 = dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000030,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000038,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 * dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_158,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      dVar3 = *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_198,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      dVar3 = dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000020,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000028,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 * dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&stack0xfffffffffffffe28,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      dVar3 = *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&stack0xfffffffffffffde8,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      dVar3 = dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000040,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 + *pvVar2;
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000048,(long)local_280);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_284);
      *pvVar2 = dVar3 * dVar3 + *pvVar2;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_deltaeta_chdep(
    vector<vector<double>> &event_Qn_p_rap_real,
    vector<vector<double>> &event_Qn_p_rap_imag,
    vector<vector<double>> &event_Qn_m_rap_real,
    vector<vector<double>> &event_Qn_m_rap_imag,
    vector<vector<double>> &event_Qn_rap_real,
    vector<vector<double>> &event_Qn_rap_imag,
    vector<vector<double>> &Cmnk_ss_eta12,
    vector<vector<double>> &Cmnk_ss_eta12_err,
    vector<vector<double>> &Cmnk_os_eta12,
    vector<vector<double>> &Cmnk_os_eta12_err,
    vector<vector<double>> &Cmnk_ss_eta13,
    vector<vector<double>> &Cmnk_ss_eta13_err,
    vector<vector<double>> &Cmnk_os_eta13,
    vector<vector<double>> &Cmnk_os_eta13_err) {
    vector<vector<double>> temp_Cmnk_ss_1(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_2(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_3(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_4(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_1(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_2(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_3(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_4(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_err(num_corr, vector<double>(N_rap, 0.));

    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 2,
        temp_Cmnk_os_1, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 2,
        temp_Cmnk_os_2, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 2,
        temp_Cmnk_os_3, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 2,
        temp_Cmnk_os_4, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 1,
        temp_Cmnk_ss_1, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 1,
        temp_Cmnk_ss_2, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 1,
        temp_Cmnk_ss_3, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 1,
        temp_Cmnk_ss_4, temp_Cmnk_err);

    for (int i = 0; i < num_corr; i++) {
        for (int j = 0; j < N_rap; j++) {
            double temp_ss_12 = temp_Cmnk_ss_1[i][j] + temp_Cmnk_ss_2[i][j];
            Cmnk_ss_eta12[i][j] += temp_ss_12;
            Cmnk_ss_eta12_err[i][j] += temp_ss_12 * temp_ss_12;
            double temp_ss_13 = temp_Cmnk_ss_3[i][j] + temp_Cmnk_ss_4[i][j];
            Cmnk_ss_eta13[i][j] += temp_ss_13;
            Cmnk_ss_eta13_err[i][j] += temp_ss_13 * temp_ss_13;
            double temp_os_12 = temp_Cmnk_os_1[i][j] + temp_Cmnk_os_2[i][j];
            Cmnk_os_eta12[i][j] += temp_os_12;
            Cmnk_os_eta12_err[i][j] += temp_os_12 * temp_os_12;
            double temp_os_13 = temp_Cmnk_os_3[i][j] + temp_Cmnk_os_4[i][j];
            Cmnk_os_eta13[i][j] += temp_os_13;
            Cmnk_os_eta13_err[i][j] += temp_os_13 * temp_os_13;
        }
    }
}